

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmNinjaTargetGenerator::WriteTargetDependInfo(cmNinjaTargetGenerator *this,string *lang)

{
  cmMakefile *pcVar1;
  cmGeneratorTarget *pcVar2;
  cmLocalNinjaGenerator *this_00;
  ptrdiff_t lang_00;
  bool bVar3;
  Value *pVVar4;
  string *psVar5;
  ulong uVar6;
  reference value;
  undefined1 local_610 [8];
  cmGeneratedFileStream tdif;
  string tdin;
  string *l;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linked;
  Value *tdi_linked_target_dirs;
  Value local_2f8;
  reference local_2d0;
  string *i;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  Value *tdi_include_dirs;
  Value local_240;
  Value local_218;
  Value local_1f0;
  allocator<char> local_1c1;
  string local_1c0;
  Value local_1a0;
  allocator<char> local_171;
  string local_170;
  Value local_150;
  Value local_128;
  undefined1 local_100 [8];
  string mod_dir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  Value local_a0;
  Value local_68;
  undefined1 local_40 [8];
  Value tdi;
  string *lang_local;
  cmNinjaTargetGenerator *this_local;
  
  tdi.limit_ = (ptrdiff_t)lang;
  Json::Value::Value((Value *)local_40,objectValue);
  Json::Value::Value(&local_68,(string *)tdi.limit_);
  pVVar4 = Json::Value::operator[]((Value *)local_40,"language");
  Json::Value::operator=(pVVar4,&local_68);
  Json::Value::~Value(&local_68);
  pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&mod_dir.field_2 + 8),"CMAKE_",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)tdi.limit_);
  std::operator+(&local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&mod_dir.field_2 + 8),"_COMPILER_ID");
  psVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_c0);
  Json::Value::Value(&local_a0,psVar5);
  pVVar4 = Json::Value::operator[]((Value *)local_40,"compiler-id");
  Json::Value::operator=(pVVar4,&local_a0);
  Json::Value::~Value(&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)(mod_dir.field_2._M_local_buf + 8));
  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          tdi.limit_,"Fortran");
  if (bVar3) {
    pcVar2 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    psVar5 = cmMakefile::GetHomeOutputDirectory_abi_cxx11_
                       ((this->super_cmCommonTargetGenerator).Makefile);
    cmGeneratorTarget::GetFortranModuleDirectory((string *)local_100,pcVar2,psVar5);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) != 0) {
      psVar5 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_
                         ((this->super_cmCommonTargetGenerator).Makefile);
      std::__cxx11::string::operator=((string *)local_100,(string *)psVar5);
    }
    Json::Value::Value(&local_128,(string *)local_100);
    pVVar4 = Json::Value::operator[]((Value *)local_40,"module-dir");
    Json::Value::operator=(pVVar4,&local_128);
    Json::Value::~Value(&local_128);
    pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_170,"CMAKE_Fortran_SUBMODULE_SEP",&local_171);
    psVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_170);
    Json::Value::Value(&local_150,psVar5);
    pVVar4 = Json::Value::operator[]((Value *)local_40,"submodule-sep");
    Json::Value::operator=(pVVar4,&local_150);
    Json::Value::~Value(&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    std::allocator<char>::~allocator(&local_171);
    pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,"CMAKE_Fortran_SUBMODULE_EXT",&local_1c1);
    psVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_1c0);
    Json::Value::Value(&local_1a0,psVar5);
    pVVar4 = Json::Value::operator[]((Value *)local_40,"submodule-ext");
    Json::Value::operator=(pVVar4,&local_1a0);
    Json::Value::~Value(&local_1a0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::allocator<char>::~allocator(&local_1c1);
    std::__cxx11::string::~string((string *)local_100);
  }
  psVar5 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value(&local_1f0,psVar5);
  pVVar4 = Json::Value::operator[]((Value *)local_40,"dir-cur-bld");
  Json::Value::operator=(pVVar4,&local_1f0);
  Json::Value::~Value(&local_1f0);
  psVar5 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value(&local_218,psVar5);
  pVVar4 = Json::Value::operator[]((Value *)local_40,"dir-cur-src");
  Json::Value::operator=(pVVar4,&local_218);
  Json::Value::~Value(&local_218);
  psVar5 = cmMakefile::GetHomeOutputDirectory_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value(&local_240,psVar5);
  pVVar4 = Json::Value::operator[]((Value *)local_40,"dir-top-bld");
  Json::Value::operator=(pVVar4,&local_240);
  Json::Value::~Value(&local_240);
  psVar5 = cmMakefile::GetHomeDirectory_abi_cxx11_((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value((Value *)&tdi_include_dirs,psVar5);
  pVVar4 = Json::Value::operator[]((Value *)local_40,"dir-top-src");
  Json::Value::operator=(pVVar4,(Value *)&tdi_include_dirs);
  Json::Value::~Value((Value *)&tdi_include_dirs);
  Json::Value::Value((Value *)&includes.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,arrayValue);
  pVVar4 = Json::Value::operator[]((Value *)local_40,"include-dirs");
  pVVar4 = Json::Value::operator=
                     (pVVar4,(Value *)&includes.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Json::Value::~Value((Value *)&includes.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range1);
  lang_00 = tdi.limit_;
  pcVar2 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  this_00 = this->LocalGenerator;
  psVar5 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_(&this->super_cmCommonTargetGenerator);
  cmLocalGenerator::GetIncludeDirectories
            ((cmLocalGenerator *)this_00,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range1,pcVar2,(string *)lang_00,psVar5);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range1);
  i = (string *)
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range1);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&i), bVar3) {
    local_2d0 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end1);
    ConvertToNinjaPath((string *)&tdi_linked_target_dirs,this,local_2d0);
    Json::Value::Value(&local_2f8,(string *)&tdi_linked_target_dirs);
    Json::Value::append(pVVar4,&local_2f8);
    Json::Value::~Value(&local_2f8);
    std::__cxx11::string::~string((string *)&tdi_linked_target_dirs);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  Json::Value::Value((Value *)&linked.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,arrayValue);
  pVVar4 = Json::Value::operator[]((Value *)local_40,"linked-target-dirs");
  pVVar4 = Json::Value::operator=
                     (pVVar4,(Value *)&linked.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Json::Value::~Value((Value *)&linked.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cmCommonTargetGenerator::GetLinkedTargetDirectories_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range1_1,&this->super_cmCommonTargetGenerator);
  __end1_1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range1_1);
  l = (string *)
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range1_1);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&l), bVar3) {
    value = __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator*(&__end1_1);
    Json::Value::Value((Value *)((long)&tdin.field_2 + 8),value);
    Json::Value::append(pVVar4,(Value *)((long)&tdin.field_2 + 8));
    Json::Value::~Value((Value *)((long)&tdin.field_2 + 8));
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1_1);
  }
  GetTargetDependInfoPath((string *)&tdif.field_0x240,this,(string *)tdi.limit_);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_610,(string *)&tdif.field_0x240,false,None);
  Json::operator<<((ostream *)local_610,(Value *)local_40);
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_610);
  std::__cxx11::string::~string((string *)&tdif.field_0x240);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range1_1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range1);
  Json::Value::~Value((Value *)local_40);
  return;
}

Assistant:

void cmNinjaTargetGenerator::WriteTargetDependInfo(std::string const& lang)
{
  Json::Value tdi(Json::objectValue);
  tdi["language"] = lang;
  tdi["compiler-id"] =
    this->Makefile->GetSafeDefinition("CMAKE_" + lang + "_COMPILER_ID");

  if (lang == "Fortran") {
    std::string mod_dir = this->GeneratorTarget->GetFortranModuleDirectory(
      this->Makefile->GetHomeOutputDirectory());
    if (mod_dir.empty()) {
      mod_dir = this->Makefile->GetCurrentBinaryDirectory();
    }
    tdi["module-dir"] = mod_dir;
    tdi["submodule-sep"] =
      this->Makefile->GetSafeDefinition("CMAKE_Fortran_SUBMODULE_SEP");
    tdi["submodule-ext"] =
      this->Makefile->GetSafeDefinition("CMAKE_Fortran_SUBMODULE_EXT");
  }

  tdi["dir-cur-bld"] = this->Makefile->GetCurrentBinaryDirectory();
  tdi["dir-cur-src"] = this->Makefile->GetCurrentSourceDirectory();
  tdi["dir-top-bld"] = this->Makefile->GetHomeOutputDirectory();
  tdi["dir-top-src"] = this->Makefile->GetHomeDirectory();

  Json::Value& tdi_include_dirs = tdi["include-dirs"] = Json::arrayValue;
  std::vector<std::string> includes;
  this->LocalGenerator->GetIncludeDirectories(includes, this->GeneratorTarget,
                                              lang, this->GetConfigName());
  for (std::string const& i : includes) {
    // Convert the include directories the same way we do for -I flags.
    // See upstream ninja issue 1251.
    tdi_include_dirs.append(this->ConvertToNinjaPath(i));
  }

  Json::Value& tdi_linked_target_dirs = tdi["linked-target-dirs"] =
    Json::arrayValue;
  std::vector<std::string> linked = this->GetLinkedTargetDirectories();
  for (std::string const& l : linked) {
    tdi_linked_target_dirs.append(l);
  }

  std::string const tdin = this->GetTargetDependInfoPath(lang);
  cmGeneratedFileStream tdif(tdin);
  tdif << tdi;
}